

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O2

int64_t av1_rd_pick_intra_sbuv_mode
                  (AV1_COMP *cpi,MACROBLOCK *x,int *rate,int *rate_tokenonly,int64_t *distortion,
                  uint8_t *skippable,BLOCK_SIZE bsize,TX_SIZE max_tx_size)

{
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO *pMVar1;
  bool bVar2;
  byte bVar3;
  TX_SIZE tx_size;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  _Bool *p_Var9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  MACROBLOCKD *xd;
  RD_STATS *pRVar14;
  long lVar15;
  char cVar16;
  int64_t iVar17;
  long lVar18;
  byte bVar19;
  int i;
  ulong uVar20;
  buf_2d *ref;
  uint8_t *puVar21;
  int cfl_linear_idx;
  long local_cc0;
  RD_STATS *local_ca8;
  RD_STATS tokenonly_rd_stats;
  int best_angle_delta;
  int iStack_c64;
  long lStack_c60;
  int64_t local_c58;
  long lStack_c50;
  long local_c48;
  MACROBLOCKD *local_c38;
  int (*local_c30) [13] [14];
  int local_c24;
  _Bool *local_c20;
  long local_c18;
  int64_t *local_c10;
  int *local_c08;
  int *local_c00;
  int (*local_bf8) [2] [16];
  ulong local_bf0;
  int64_t best_rd;
  int (*local_be0) [13] [14];
  _Bool *local_bd8;
  buf_2d *local_bd0;
  ulong local_bc8;
  ulong local_bc0;
  long local_bb8;
  ulong local_bb0;
  IntraModeSearchState intra_search_state;
  MB_MODE_INFO best_mbmi;
  RD_STATS cfl_rd_arr_v [33];
  RD_STATS cfl_rd_arr_u [33];
  
  mbmi = *(x->e_mbd).mi;
  memcpy(&best_mbmi,mbmi,0xb0);
  best_rd = 0x7fffffffffffffff;
  mbmi->uv_mode = '\0';
  (mbmi->palette_mode_info).palette_size[1] = '\0';
  if ((x->e_mbd).is_chroma_ref == false) {
    *rate = 0;
    *rate_tokenonly = 0;
    *distortion = 0;
    *skippable = '\x01';
    return 0x7fffffffffffffff;
  }
  xd = &x->e_mbd;
  local_c10 = distortion;
  local_c08 = rate_tokenonly;
  local_c00 = rate;
  if (((cpi->common).seq_params)->monochrome == '\0') {
    bVar3 = is_cfl_allowed(xd);
    (x->e_mbd).cfl.store_y = (uint)bVar3;
    if (bVar3 == 0) goto LAB_00222ab7;
    av1_encode_intra_block_plane
              (cpi,x,mbmi->bsize,0,'\x01',cpi->optimize_seg_arr[*(ushort *)&mbmi->field_0xa7 & 7]);
  }
  (x->e_mbd).cfl.store_y = 0;
LAB_00222ab7:
  intra_search_state.directional_mode_skip_mask[8] = '\0';
  intra_search_state.directional_mode_skip_mask[9] = '\0';
  intra_search_state.directional_mode_skip_mask[10] = '\0';
  intra_search_state.directional_mode_skip_mask[0xb] = '\0';
  intra_search_state.directional_mode_skip_mask[0xc] = '\0';
  intra_search_state._21_3_ = 0;
  intra_search_state.pmi_uv.palette_colors[0xf] = 0;
  intra_search_state.pmi_uv.palette_colors[0x10] = 0;
  intra_search_state.pmi_uv.palette_colors[0x11] = 0;
  intra_search_state.pmi_uv.palette_colors[0x12] = 0;
  intra_search_state.pmi_uv.palette_colors[0x13] = 0;
  intra_search_state.pmi_uv.palette_colors[0x14] = 0;
  intra_search_state.pmi_uv.palette_colors[0x15] = 0;
  intra_search_state.pmi_uv.palette_colors[0x16] = 0;
  intra_search_state.pmi_uv.palette_colors[7] = 0;
  intra_search_state.pmi_uv.palette_colors[8] = 0;
  intra_search_state.pmi_uv.palette_colors[9] = 0;
  intra_search_state.pmi_uv.palette_colors[10] = 0;
  intra_search_state.pmi_uv.palette_colors[0xb] = 0;
  intra_search_state.pmi_uv.palette_colors[0xc] = 0;
  intra_search_state.pmi_uv.palette_colors[0xd] = 0;
  intra_search_state.pmi_uv.palette_colors[0xe] = 0;
  intra_search_state.skip_uvs = '\0';
  intra_search_state.mode_uv = '\0';
  intra_search_state.pmi_uv.palette_colors[0] = 0;
  intra_search_state.pmi_uv.palette_colors[1] = 0;
  intra_search_state.pmi_uv.palette_colors[2] = 0;
  intra_search_state.pmi_uv.palette_colors[3] = 0;
  intra_search_state.pmi_uv.palette_colors[4] = 0;
  intra_search_state.pmi_uv.palette_colors[5] = 0;
  intra_search_state.pmi_uv.palette_colors[6] = 0;
  intra_search_state.rate_uv_tokenonly = 0;
  intra_search_state._36_4_ = 0;
  intra_search_state.dist_uvs = 0;
  intra_search_state.best_intra_mode = '\0';
  intra_search_state._1_3_ = 0;
  intra_search_state.skip_intra_modes = 0;
  intra_search_state.directional_mode_skip_mask[0] = '\0';
  intra_search_state.directional_mode_skip_mask[1] = '\0';
  intra_search_state.directional_mode_skip_mask[2] = '\0';
  intra_search_state.directional_mode_skip_mask[3] = '\0';
  intra_search_state.directional_mode_skip_mask[4] = '\0';
  intra_search_state.directional_mode_skip_mask[5] = '\0';
  intra_search_state.directional_mode_skip_mask[6] = '\0';
  intra_search_state.directional_mode_skip_mask[7] = '\0';
  intra_search_state.pmi_uv.palette_colors[0x17] = 0;
  intra_search_state.pmi_uv.palette_size[0] = '\0';
  intra_search_state.pmi_uv.palette_size[1] = '\0';
  intra_search_state.uv_angle_delta = '\0';
  intra_search_state._101_3_ = 0;
  intra_search_state.dir_mode_skip_mask_ready = 0;
  intra_search_state.rate_uv_intra = 0x7fffffff;
  bVar3 = is_cfl_allowed(xd);
  local_be0 = (x->mode_costs).intra_uv_mode_cost;
  local_bc0 = (ulong)bVar3;
  local_bb0 = (ulong)max_tx_size;
  local_bd8 = (_Bool *)&mbmi->cfl_alpha_signs;
  local_bf8 = (x->mode_costs).cfl_cost;
  local_c20 = (x->e_mbd).cfl.dc_pred_is_cached + 1;
  local_bd0 = &x->plane[1].src;
  local_c30 = local_be0 + local_bc0;
  local_c18 = 0x7fffffffffffffff;
  local_cc0 = 0x7fffffffffffffff;
  bVar2 = false;
  uVar13 = 0;
  do {
    if (uVar13 == 0xe) {
      if (((cpi->oxcf).tool_cfg.enable_palette != false) &&
         (iVar10 = av1_allow_palette((uint)(cpi->common).features.allow_screen_content_tools,
                                     mbmi->bsize), iVar10 != 0)) {
        av1_rd_pick_palette_intra_sbuv
                  (cpi,x,(*local_c30)[mbmi->mode][0],x->palette_buffer->best_palette_color_map,
                   &best_mbmi,&best_rd,local_c00,local_c08,local_c10,skippable);
        local_cc0 = best_rd;
      }
      memcpy(mbmi,&best_mbmi,0xb0);
      return local_cc0;
    }
    bVar3 = ""[uVar13];
    uVar20 = (ulong)bVar3;
    if ((long)x->rdmult * (long)(*local_c30)[mbmi->mode][uVar20] + 0x100 >> 9 <= local_cc0) {
      bVar19 = get_uv_mode_uv2y[uVar20] - 9;
      if (bVar19 < 0xfa) {
        if (0xf7 < bVar19) {
LAB_00222c09:
          if ((cpi->oxcf).intra_mode_cfg.enable_directional_intra != true) goto LAB_00222bdd;
        }
        if (((((uint)(cpi->sf).intra_sf.intra_uv_mode_mask[""[local_bb0]] >> (bVar3 & 0x1f) & 1) !=
              0) && ((((((uint)uVar13 & 0xb) == 1 ||
                       ((cpi->oxcf).intra_mode_cfg.enable_smooth_intra != false)) ||
                      ((0xf2UL >> (uVar13 & 0x3f) & 1) == 0)) &&
                     ((uVar13 != 5 || ((cpi->oxcf).intra_mode_cfg.enable_paeth_intra != false))))))
           && (((cpi->sf).intra_sf.prune_chroma_modes_using_luma_winner == 0 ||
               ((1 << (bVar3 & 0x1f) & (uint)av1_derived_chroma_intra_mode_used_flag[mbmi->mode]) !=
                0)))) {
          mbmi->uv_mode = bVar3;
          mbmi->angle_delta[1] = '\0';
          local_bc8 = uVar20;
          if (uVar13 == 1) {
            if ((local_bc0 != 0) && ((cpi->oxcf).intra_mode_cfg.enable_cfl_intra == true)) {
              tx_size = av1_get_tx_size((int)xd,(MACROBLOCKD *)x);
              iVar10 = (cpi->sf).intra_sf.cfl_search_range;
              tokenonly_rd_stats.rate = 0x7fffffff;
              tokenonly_rd_stats.zero_rate = 0;
              tokenonly_rd_stats.dist = 0x7fffffffffffffff;
              tokenonly_rd_stats.rdcost = 0x7fffffffffffffff;
              tokenonly_rd_stats.sse = 0x7fffffffffffffff;
              tokenonly_rd_stats._32_8_ = tokenonly_rd_stats._32_8_ & 0xffffffffffffff00;
              (x->e_mbd).cfl.use_dc_pred_cache = true;
              iVar4 = cfl_pick_plane_parameter(cpi,x,1,tx_size,iVar10);
              iVar5 = cfl_pick_plane_parameter(cpi,x,2,tx_size,iVar10);
              if (iVar10 == 1) {
                if (iVar5 != 0x10 || iVar4 != 0x10) {
                  uVar20._4_4_ = iVar4 + -0x10;
                  if (uVar20._4_4_ == 0) {
                    lVar11 = -1;
                    lVar18 = 0;
                  }
                  else {
                    iVar7 = -uVar20._4_4_;
                    if (0 < uVar20._4_4_) {
                      iVar7 = uVar20._4_4_;
                    }
                    lVar18 = (long)(iVar7 + -1);
                    lVar11 = (ulong)(0x10 < iVar4) * 3 + 2;
                  }
                  uVar20._4_4_ = iVar5 + -0x10;
                  if (uVar20._4_4_ == 0) {
                    lVar12 = 0;
                    lVar15 = 0;
                  }
                  else {
                    iVar7 = -uVar20._4_4_;
                    if (0 < uVar20._4_4_) {
                      iVar7 = uVar20._4_4_;
                    }
                    lVar12 = (ulong)(0x10 < iVar5) + 1;
                    lVar15 = (long)(iVar7 + -1);
                  }
                  pMVar1 = *(x->e_mbd).mi;
                  uVar20._4_4_ = local_bf8[lVar12 + lVar11][0][lVar18];
                  iVar7 = local_bf8[lVar12 + lVar11][1][lVar15];
                  bVar3 = is_cfl_allowed(xd);
                  if ((long)x->rdmult *
                      ((long)local_be0[bVar3][pMVar1->mode][0xd] + (long)iVar7 + (long)uVar20._4_4_)
                      + 0x100 >> 9 <= local_cc0) goto LAB_00223365;
                }
                mbmi->cfl_alpha_signs = '\0';
                mbmi->cfl_alpha_idx = '\0';
                (x->e_mbd).cfl.use_dc_pred_cache = false;
                (x->e_mbd).cfl.dc_pred_is_cached[0] = false;
                p_Var9 = local_c20;
              }
              else {
LAB_00223365:
                cfl_pick_plane_rd(cpi,x,1,tx_size,iVar10,cfl_rd_arr_u,iVar4);
                cfl_pick_plane_rd(cpi,x,2,tx_size,iVar10,cfl_rd_arr_v,iVar5);
                (x->e_mbd).cfl.use_dc_pred_cache = false;
                (x->e_mbd).cfl.dc_pred_is_cached[0] = false;
                (x->e_mbd).cfl.dc_pred_is_cached[1] = false;
                uVar8 = 0;
                local_c38 = xd;
                while (uVar8 != 0x21) {
                  local_bf0 = uVar8;
                  if (cfl_rd_arr_u[uVar8].rate != 0x7fffffff) {
                    if (uVar8 - 0x10 == 0) {
                      cVar16 = '\0';
                      iVar10 = 0;
                    }
                    else {
                      cVar16 = '\x02' - (uVar8 < 0x11);
                      iVar4 = (int)(uVar8 - 0x10);
                      iVar10 = -iVar4;
                      if (0 < iVar4) {
                        iVar10 = iVar4;
                      }
                      iVar10 = iVar10 + -1;
                    }
                    local_bb8 = (long)iVar10;
                    pRVar14 = cfl_rd_arr_v;
                    for (lVar11 = -0x10; lVar11 != 0x11; lVar11 = lVar11 + 1) {
                      if ((long)pRVar14->rate != 0x7fffffff) {
                        if (lVar11 == 0) {
                          iVar4 = 0;
                          iVar5 = 0;
                          if (cVar16 == '\0') goto LAB_00223644;
                        }
                        else {
                          iVar5 = (int)lVar11;
                          iVar4 = -iVar5;
                          if (0 < iVar5) {
                            iVar4 = iVar5;
                          }
                          iVar4 = iVar4 + -1;
                          iVar5 = 2 - (uint)(lVar11 + 0x10U < 0x11);
                        }
                        iVar5 = iVar5 + ((byte)(cVar16 * '\x03') - 1);
                        uVar20._0_4_ = cfl_rd_arr_u[uVar8].rate;
                        uVar20._4_4_ = cfl_rd_arr_u[uVar8].zero_rate;
                        local_c58 = cfl_rd_arr_u[uVar8].rdcost;
                        lStack_c50 = cfl_rd_arr_u[uVar8].sse;
                        local_c48._1_7_ =
                             (uint7)((ulong)*(undefined8 *)&cfl_rd_arr_u[uVar8].skip_txfm >> 8);
                        if ((long)(int)(undefined4)uVar20 == 0x7fffffff) {
                          lStack_c60 = 0x7fffffffffffffff;
                          local_c58 = 0x7fffffffffffffff;
                          lStack_c50 = 0x7fffffffffffffff;
                          local_c48 = (ulong)local_c48._1_7_ << 8;
                          _best_angle_delta = uVar20 & 0xffffffff;
                        }
                        else {
                          lVar18 = (long)(int)(undefined4)uVar20 + (long)pRVar14->rate;
                          if (0x7ffffffe < lVar18) {
                            lVar18 = 0x7fffffff;
                          }
                          iVar7 = (int)lVar18;
                          if (uVar20._4_4_ == 0) {
                            uVar20._4_4_ = pRVar14->zero_rate;
                          }
                          _best_angle_delta = CONCAT44(uVar20._4_4_,iVar7);
                          lStack_c60 = cfl_rd_arr_u[uVar8].dist + pRVar14->dist;
                          if ((lStack_c50 != 0x7fffffffffffffff) &&
                             (pRVar14->sse != 0x7fffffffffffffff)) {
                            lStack_c50 = pRVar14->sse + lStack_c50;
                          }
                          local_c48._0_1_ = (byte)*(undefined8 *)&cfl_rd_arr_u[uVar8].skip_txfm;
                          local_c48 = CONCAT71(local_c48._1_7_,(byte)local_c48 & pRVar14->skip_txfm)
                          ;
                          if (iVar7 != 0x7fffffff) {
                            _best_angle_delta =
                                 CONCAT44(uVar20._4_4_,
                                          iVar7 + local_bf8[iVar5][0][local_bb8] +
                                          local_bf8[iVar5][1][iVar4]);
                          }
                        }
                        av1_rd_cost_update(x->rdmult,(RD_STATS *)&best_angle_delta);
                        if (local_c58 < tokenonly_rd_stats.rdcost) {
                          tokenonly_rd_stats._32_8_ = local_c48;
                          tokenonly_rd_stats.rdcost = local_c58;
                          tokenonly_rd_stats.sse = lStack_c50;
                          tokenonly_rd_stats.rate = best_angle_delta;
                          tokenonly_rd_stats.zero_rate = iStack_c64;
                          tokenonly_rd_stats.dist = lStack_c60;
                          mbmi->cfl_alpha_idx = (char)iVar4 + (char)(iVar10 << 4);
                          mbmi->cfl_alpha_signs = (int8_t)iVar5;
                        }
                      }
LAB_00223644:
                      pRVar14 = pRVar14 + 1;
                    }
                  }
                  uVar8 = local_bf0 + 1;
                }
                xd = local_c38;
                if (tokenonly_rd_stats.rdcost < local_cc0) goto LAB_00222f20;
                tokenonly_rd_stats.rate = 0x7fffffff;
                tokenonly_rd_stats.zero_rate = 0;
                tokenonly_rd_stats.dist = 0x7fffffffffffffff;
                tokenonly_rd_stats.rdcost = 0x7fffffffffffffff;
                tokenonly_rd_stats.sse = 0x7fffffffffffffff;
                tokenonly_rd_stats._32_8_ = tokenonly_rd_stats._32_8_ & 0xffffffffffffff00;
                mbmi->cfl_alpha_idx = '\0';
                p_Var9 = local_bd8;
              }
              *p_Var9 = false;
            }
          }
          else if (((bVar19 < 0xf8) || (mbmi->bsize < BLOCK_8X8)) ||
                  ((cpi->oxcf).intra_mode_cfg.enable_angle_delta != true)) {
            if ((uVar13 == 4) && ((cpi->sf).intra_sf.prune_smooth_intra_mode_for_chroma == true)) {
              uVar20 = 1;
              ref = local_bd0;
              do {
                if ((((cpi->common).seq_params)->monochrome != '\0') || (2 < uVar20))
                goto LAB_00222bdd;
                uVar6 = av1_get_perpixel_variance_facade(cpi,xd,ref,bsize,(int)uVar20);
                uVar20 = uVar20 + 1;
                ref = (buf_2d *)&ref[4].buf0;
              } while (uVar6 < 0x14);
            }
            iVar10 = av1_txfm_uvrd(cpi,x,&tokenonly_rd_stats,bsize,local_cc0);
            if (iVar10 != 0) {
LAB_00222f20:
              lVar18 = (long)tokenonly_rd_stats.rate;
              iVar10 = intra_mode_info_cost_uv(cpi,x,mbmi,bsize,(*local_c30)[mbmi->mode][local_bc8])
              ;
              iVar17 = tokenonly_rd_stats.dist;
              lVar11 = tokenonly_rd_stats.dist * 0x80 +
                       ((long)x->rdmult * (iVar10 + lVar18) + 0x100 >> 9);
              local_cc0 = local_c18;
              if (lVar11 < local_c18) {
                memcpy(&best_mbmi,mbmi,0xb0);
                *local_c00 = (int)(iVar10 + lVar18);
                *local_c08 = tokenonly_rd_stats.rate;
                *local_c10 = iVar17;
                *skippable = tokenonly_rd_stats.skip_txfm;
                local_cc0 = lVar11;
                local_c18 = lVar11;
                best_rd = lVar11;
              }
            }
          }
          else {
            lVar11 = (long)(cpi->sf).intra_sf.chroma_intra_pruning_with_hog;
            if (!bVar2 && lVar11 != 0) {
              bVar2 = true;
              prune_intra_mode_with_hog
                        (x,bsize,((cpi->common).seq_params)->sb_size,
                         *(float *)("\x01\x03\x05\x01\x01\x01\t\x01\x01\x01\x01\x01\x11" +
                                   lVar11 * 4 +
                                   (ulong)(((cpi->common).current_frame.frame_type & 0xfd) == 0) *
                                   0x10 + 9),intra_search_state.directional_mode_skip_mask,1);
              intra_search_state.dir_mode_skip_mask_ready = 1;
            }
            if (intra_search_state.directional_mode_skip_mask[uVar20] == '\0') {
              iVar10 = (*local_c30)[mbmi->mode][uVar20];
              cfl_rd_arr_v[0].rate = (undefined4)local_cc0;
              cfl_rd_arr_v[0].zero_rate = local_cc0._4_4_;
              pMVar1 = *(x->e_mbd).mi;
              _best_angle_delta = _best_angle_delta & 0xffffffff00000000;
              tokenonly_rd_stats.rate = 0x7fffffff;
              tokenonly_rd_stats._32_8_ = tokenonly_rd_stats._32_8_ & 0xffffffffffffff00;
              tokenonly_rd_stats.dist = 0x7fffffffffffffff;
              for (lVar11 = 0; lVar11 != 10; lVar11 = lVar11 + 1) {
                *(undefined8 *)(&cfl_rd_arr_u[0].rate + lVar11 * 2) = 0x7fffffffffffffff;
              }
              cVar16 = '\0';
              local_ca8 = cfl_rd_arr_u;
              local_c38 = xd;
              for (uVar20 = 0; uVar20 < 4; uVar20 = uVar20 + 2) {
                uVar8 = uVar20 & 0xffffffff;
                lVar11 = 0;
                do {
                  if (lVar11 == 2) goto LAB_00223184;
                  iVar17 = ((long)cfl_rd_arr_v[0]._0_8_ >> (uVar20 != 0) * '\x02' + 3) +
                           cfl_rd_arr_v[0]._0_8_;
                  if (cfl_rd_arr_v[0]._0_8_ == 0x7fffffffffffffff) {
                    iVar17 = 0x7fffffffffffffff;
                  }
                  pMVar1->angle_delta[1] = (char)uVar8;
                  iVar17 = pick_intra_angle_routine_sbuv
                                     (cpi,x,bsize,iVar10,iVar17,&local_c24,&tokenonly_rd_stats,
                                      &best_angle_delta,(int64_t *)cfl_rd_arr_v);
                  *(int64_t *)(&local_ca8->rate + lVar11 * 2) = iVar17;
                  lVar11 = lVar11 + 1;
                  uVar8 = (ulong)(byte)((char)uVar8 + cVar16);
                } while (uVar20 != 0);
                xd = local_c38;
                if (iVar17 == 0x7fffffffffffffff) goto LAB_00222bdd;
                cfl_rd_arr_u[0].dist = iVar17;
LAB_00223184:
                local_ca8 = (RD_STATS *)&local_ca8->skip_txfm;
                cVar16 = cVar16 + -4;
              }
              cVar16 = -2;
              puVar21 = &cfl_rd_arr_u[0].skip_txfm;
              for (uVar20 = 1; uVar20 < 4; uVar20 = uVar20 + 2) {
                uVar8 = uVar20 & 0xffffffff;
                for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
                  lVar18 = ((long)cfl_rd_arr_v[0]._0_8_ >> 5) + cfl_rd_arr_v[0]._0_8_;
                  if ((*(long *)(puVar21 + lVar11 * 8) <= lVar18) ||
                     (*(long *)(puVar21 + lVar11 * 8 + -0x20) <= lVar18)) {
                    pMVar1->angle_delta[1] = (char)uVar8;
                    pick_intra_angle_routine_sbuv
                              (cpi,x,bsize,iVar10,cfl_rd_arr_v[0]._0_8_,&local_c24,
                               &tokenonly_rd_stats,&best_angle_delta,(int64_t *)cfl_rd_arr_v);
                  }
                  uVar8 = (ulong)(byte)((char)uVar8 + cVar16);
                }
                puVar21 = puVar21 + 0x20;
                cVar16 = cVar16 + -4;
              }
              pMVar1->angle_delta[1] = (int8_t)best_angle_delta;
              xd = local_c38;
              if (tokenonly_rd_stats.rate != 0x7fffffff) goto LAB_00222f20;
            }
          }
        }
      }
      else if ((cpi->oxcf).intra_mode_cfg.enable_diagonal_intra != false) goto LAB_00222c09;
    }
LAB_00222bdd:
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

int64_t av1_rd_pick_intra_sbuv_mode(const AV1_COMP *const cpi, MACROBLOCK *x,
                                    int *rate, int *rate_tokenonly,
                                    int64_t *distortion, uint8_t *skippable,
                                    BLOCK_SIZE bsize, TX_SIZE max_tx_size) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  MB_MODE_INFO best_mbmi = *mbmi;
  int64_t best_rd = INT64_MAX, this_rd;
  const ModeCosts *mode_costs = &x->mode_costs;
  const IntraModeCfg *const intra_mode_cfg = &cpi->oxcf.intra_mode_cfg;

  init_sbuv_mode(mbmi);

  // Return if the current block does not correspond to a chroma block.
  if (!xd->is_chroma_ref) {
    *rate = 0;
    *rate_tokenonly = 0;
    *distortion = 0;
    *skippable = 1;
    return INT64_MAX;
  }

  // Only store reconstructed luma when there's chroma RDO. When there's no
  // chroma RDO, the reconstructed luma will be stored in encode_superblock().
  xd->cfl.store_y = store_cfl_required_rdo(cm, x);
  if (xd->cfl.store_y) {
    // Restore reconstructed luma values.
    // TODO(chiyotsai@google.com): right now we are re-computing the txfm in
    // this function everytime we search through uv modes. There is some
    // potential speed up here if we cache the result to avoid redundant
    // computation.
    av1_encode_intra_block_plane(cpi, x, mbmi->bsize, AOM_PLANE_Y,
                                 DRY_RUN_NORMAL,
                                 cpi->optimize_seg_arr[mbmi->segment_id]);
    xd->cfl.store_y = 0;
  }
  IntraModeSearchState intra_search_state;
  init_intra_mode_search_state(&intra_search_state);
  const CFL_ALLOWED_TYPE cfl_allowed = is_cfl_allowed(xd);

  // Search through all non-palette modes.
  for (int mode_idx = 0; mode_idx < UV_INTRA_MODES; ++mode_idx) {
    int this_rate;
    RD_STATS tokenonly_rd_stats;
    UV_PREDICTION_MODE uv_mode = uv_rd_search_mode_order[mode_idx];

    // Skip the current mode evaluation if the RD cost derived using the mode
    // signaling rate exceeds the best_rd so far.
    const int mode_rate =
        mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][uv_mode];
    if (RDCOST(x->rdmult, mode_rate, 0) > best_rd) continue;

    PREDICTION_MODE intra_mode = get_uv_mode(uv_mode);
    const int is_diagonal_mode = av1_is_diagonal_mode(intra_mode);
    const int is_directional_mode = av1_is_directional_mode(intra_mode);

    if (is_diagonal_mode && !cpi->oxcf.intra_mode_cfg.enable_diagonal_intra)
      continue;
    if (is_directional_mode &&
        !cpi->oxcf.intra_mode_cfg.enable_directional_intra)
      continue;

    if (!(cpi->sf.intra_sf.intra_uv_mode_mask[txsize_sqr_up_map[max_tx_size]] &
          (1 << uv_mode)))
      continue;
    if (!intra_mode_cfg->enable_smooth_intra && uv_mode >= UV_SMOOTH_PRED &&
        uv_mode <= UV_SMOOTH_H_PRED)
      continue;

    if (!intra_mode_cfg->enable_paeth_intra && uv_mode == UV_PAETH_PRED)
      continue;

    assert(mbmi->mode < INTRA_MODES);
    if (cpi->sf.intra_sf.prune_chroma_modes_using_luma_winner &&
        !(av1_derived_chroma_intra_mode_used_flag[mbmi->mode] & (1 << uv_mode)))
      continue;

    mbmi->uv_mode = uv_mode;

    // Init variables for cfl and angle delta
    const SPEED_FEATURES *sf = &cpi->sf;
    mbmi->angle_delta[PLANE_TYPE_UV] = 0;
    if (uv_mode == UV_CFL_PRED) {
      if (!cfl_allowed || !intra_mode_cfg->enable_cfl_intra) continue;
      assert(!is_directional_mode);
      const TX_SIZE uv_tx_size = av1_get_tx_size(AOM_PLANE_U, xd);
      if (!cfl_rd_pick_alpha(x, cpi, uv_tx_size, best_rd,
                             sf->intra_sf.cfl_search_range, &tokenonly_rd_stats,
                             &mbmi->cfl_alpha_idx, &mbmi->cfl_alpha_signs)) {
        continue;
      }
    } else if (is_directional_mode && av1_use_angle_delta(mbmi->bsize) &&
               intra_mode_cfg->enable_angle_delta) {
      if (sf->intra_sf.chroma_intra_pruning_with_hog &&
          !intra_search_state.dir_mode_skip_mask_ready) {
        static const float thresh[2][4] = {
          { -1.2f, 0.0f, 0.0f, 1.2f },    // Interframe
          { -1.2f, -1.2f, -0.6f, 0.4f },  // Intraframe
        };
        const int is_chroma = 1;
        const int is_intra_frame = frame_is_intra_only(cm);
        prune_intra_mode_with_hog(
            x, bsize, cm->seq_params->sb_size,
            thresh[is_intra_frame]
                  [sf->intra_sf.chroma_intra_pruning_with_hog - 1],
            intra_search_state.directional_mode_skip_mask, is_chroma);
        intra_search_state.dir_mode_skip_mask_ready = 1;
      }
      if (intra_search_state.directional_mode_skip_mask[uv_mode]) {
        continue;
      }

      // Search through angle delta
      const int rate_overhead =
          mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][uv_mode];
      if (!rd_pick_intra_angle_sbuv(cpi, x, bsize, rate_overhead, best_rd,
                                    &this_rate, &tokenonly_rd_stats))
        continue;
    } else {
      if (uv_mode == UV_SMOOTH_PRED &&
          should_prune_chroma_smooth_pred_based_on_source_variance(cpi, x,
                                                                   bsize))
        continue;

      // Predict directly if we don't need to search for angle delta.
      if (!av1_txfm_uvrd(cpi, x, &tokenonly_rd_stats, bsize, best_rd)) {
        continue;
      }
    }
    const int mode_cost =
        mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][uv_mode];
    this_rate = tokenonly_rd_stats.rate +
                intra_mode_info_cost_uv(cpi, x, mbmi, bsize, mode_cost);
    this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);

    if (this_rd < best_rd) {
      best_mbmi = *mbmi;
      best_rd = this_rd;
      *rate = this_rate;
      *rate_tokenonly = tokenonly_rd_stats.rate;
      *distortion = tokenonly_rd_stats.dist;
      *skippable = tokenonly_rd_stats.skip_txfm;
    }
  }

  // Search palette mode
  const int try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                        mbmi->bsize);
  if (try_palette) {
    uint8_t *best_palette_color_map = x->palette_buffer->best_palette_color_map;
    av1_rd_pick_palette_intra_sbuv(
        cpi, x,
        mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][UV_DC_PRED],
        best_palette_color_map, &best_mbmi, &best_rd, rate, rate_tokenonly,
        distortion, skippable);
  }

  *mbmi = best_mbmi;
  // Make sure we actually chose a mode
  assert(best_rd < INT64_MAX);
  return best_rd;
}